

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void http_sse_unsubscribe(http_sse_s *sse_,uintptr_t subscription)

{
  subscription_s *s;
  long *plVar1;
  long lVar2;
  fio_lock_i ret;
  
  if (subscription != 0 && sse_ != (http_sse_s *)0x0) {
    s = *(subscription_s **)(subscription + 0x10);
    fio_lock((fio_lock_i *)&sse_[2].on_ready);
    plVar1 = *(long **)(subscription + 8);
    if (plVar1 != (long *)subscription) {
      lVar2 = *(long *)subscription;
      *plVar1 = lVar2;
      *(long **)(lVar2 + 8) = plVar1;
      free((void *)subscription);
    }
    LOCK();
    *(undefined1 *)&sse_[2].on_ready = 0;
    UNLOCK();
    fio_unsubscribe(s);
    return;
  }
  return;
}

Assistant:

void http_sse_unsubscribe(http_sse_s *sse_, uintptr_t subscription) {
  if (!sse_ || !subscription)
    return;
  http_sse_internal_s *sse = FIO_LS_EMBD_OBJ(http_sse_internal_s, sse, sse_);
  subscription_s *sub = (subscription_s *)((fio_ls_s *)subscription)->obj;
  fio_lock(&sse->lock);
  fio_ls_remove((fio_ls_s *)subscription);
  fio_unlock(&sse->lock);
  fio_unsubscribe(sub);
}